

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_dirhie.c
# Opt level: O0

CURLcode create_dir_hierarchy(char *outfile,GlobalConfig *global)

{
  CURLcode CVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  int *piVar6;
  size_t len;
  size_t seplen;
  undefined1 local_50 [7];
  _Bool skip;
  dynbuf dirbuf;
  size_t outlen;
  CURLcode result;
  GlobalConfig *global_local;
  char *outfile_local;
  
  dirbuf.toobig = strlen(outfile);
  curlx_dyn_init((dynbuf *)local_50,dirbuf.toobig + 1);
  global_local = (GlobalConfig *)outfile;
  do {
    outlen._4_4_ = CURLE_OK;
    if (*(char *)&global_local->trace_dump == '\0') {
LAB_0010e698:
      curlx_dyn_free((dynbuf *)local_50);
      return outlen._4_4_;
    }
    sVar3 = strspn((char *)global_local,"/");
    sVar4 = strcspn((char *)((long)&global_local->trace_dump + sVar3),"/");
    if (*(char *)((long)&global_local->trace_dump + sVar4 + sVar3) == '\0') goto LAB_0010e698;
    CVar1 = curlx_dyn_addn((dynbuf *)local_50,global_local,sVar3 + sVar4);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    pcVar5 = curlx_dyn_ptr((dynbuf *)local_50);
    iVar2 = mkdir(pcVar5,0x1e8);
    if (((iVar2 == -1) && (piVar6 = __errno_location(), *piVar6 != 0xd)) &&
       (piVar6 = __errno_location(), *piVar6 != 0x11)) {
      pcVar5 = curlx_dyn_ptr((dynbuf *)local_50);
      show_dir_errno(global,pcVar5);
      outlen._4_4_ = CURLE_WRITE_ERROR;
      goto LAB_0010e698;
    }
    global_local = (GlobalConfig *)((long)&global_local->trace_dump + sVar4 + sVar3);
  } while( true );
}

Assistant:

CURLcode create_dir_hierarchy(const char *outfile, struct GlobalConfig *global)
{
  CURLcode result = CURLE_OK;
  size_t outlen = strlen(outfile);
  struct curlx_dynbuf dirbuf;

  curlx_dyn_init(&dirbuf, outlen + 1);

  while(*outfile) {
    bool skip = FALSE;
    size_t seplen = strspn(outfile, PATH_DELIMITERS);
    size_t len = strcspn(&outfile[seplen], PATH_DELIMITERS);

    /* the last path component is the file and it ends with a null byte */
    if(!outfile[len + seplen])
      break;

#if defined(_WIN32) || defined(MSDOS)
    if(!curlx_dyn_len(&dirbuf)) {
      /* Skip creating a drive's current directory. It may seem as though that
         would harmlessly fail but it could be a corner case if X: did not
         exist, since we would be creating it erroneously. eg if outfile is
         X:\foo\bar\filename then do not mkdir X: This logic takes into
         account unsupported drives !:, 1:, etc. */
      if(len > 1 && (outfile[1]==':'))
        skip = TRUE;
    }
#endif
    /* insert the leading separators (possibly plural) plus the following
       directory name */
    result = curlx_dyn_addn(&dirbuf, outfile, seplen + len);
    if(result)
      return result;

    /* Create directory. Ignore access denied error to allow traversal. */
    /* !checksrc! disable ERRNOVAR 1 */
    if(!skip && (-1 == mkdir(curlx_dyn_ptr(&dirbuf), (mode_t)0000750)) &&
       (errno != EACCES) && (errno != EEXIST)) {
      show_dir_errno(global, curlx_dyn_ptr(&dirbuf));
      result = CURLE_WRITE_ERROR;
      break; /* get out of loop */
    }
    outfile += len + seplen;
  }

  curlx_dyn_free(&dirbuf);

  return result;
}